

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

void freedirs(ftp_conn *ftpc)

{
  char **ppcVar1;
  long lVar2;
  
  ppcVar1 = ftpc->dirs;
  if (ppcVar1 != (char **)0x0) {
    if (0 < ftpc->dirdepth) {
      lVar2 = 0;
      do {
        (*Curl_cfree)(ftpc->dirs[lVar2]);
        ftpc->dirs[lVar2] = (char *)0x0;
        lVar2 = lVar2 + 1;
      } while (lVar2 < ftpc->dirdepth);
      ppcVar1 = ftpc->dirs;
    }
    (*Curl_cfree)(ppcVar1);
    ftpc->dirs = (char **)0x0;
    ftpc->dirdepth = 0;
  }
  (*Curl_cfree)(ftpc->file);
  ftpc->file = (char *)0x0;
  (*Curl_cfree)(ftpc->newhost);
  ftpc->newhost = (char *)0x0;
  return;
}

Assistant:

static void freedirs(struct ftp_conn *ftpc)
{
  if(ftpc->dirs) {
    int i;
    for(i = 0; i < ftpc->dirdepth; i++) {
      free(ftpc->dirs[i]);
      ftpc->dirs[i] = NULL;
    }
    free(ftpc->dirs);
    ftpc->dirs = NULL;
    ftpc->dirdepth = 0;
  }
  Curl_safefree(ftpc->file);

  /* no longer of any use */
  Curl_safefree(ftpc->newhost);
}